

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall glcts::AdvancedUsageMultiStage::Run(AdvancedUsageMultiStage *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  GLuint *pGVar1;
  GLuint *pGVar2;
  bool bVar3;
  GLuint GVar4;
  uint *puVar5;
  GLuint *ebo;
  long lVar6;
  GLint p4;
  GLint p3;
  GLint p2;
  Vector<unsigned_int,_4> local_4d8;
  GLuint *local_4c8;
  GLint p1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> init_data;
  GLenum draw_buffers [2];
  string local_498;
  char *xfb_var [2];
  UVec4 data [67];
  
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92cc,&p1);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d2,&p2);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d0,&p3);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d6,&p4);
  if ((((p1 < 8) || (p2 < 2)) || (p3 < 8)) || (p4 < 2)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_498,
               "GL_MAX_FRAGMENT/VERTEX_ATOMIC_COUNTER_BUFFERS orGL_MAX_FRAGMENT/VERTEX_ATOMIC_COUNTERS are less than required"
               ,(allocator<char> *)data);
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_498);
    lVar6 = 0x10;
    std::__cxx11::string::~string((string *)&local_498);
  }
  else {
    GVar4 = glcts::anon_unknown_0::SACSubcaseBase::CreateProgram
                      (&this->super_SACSubcaseBase,
                       "#version 310 es\nlayout(location = 0) in vec4 i_vertex;\nflat out uint o_atomic_inc;\nflat out uint o_atomic_dec;\nlayout(binding = 1, offset = 16) uniform atomic_uint ac_counter_inc;\nlayout(binding = 7, offset = 128) uniform atomic_uint ac_counter_dec;\nvoid main() {\n  gl_Position = i_vertex;\n  o_atomic_inc = atomicCounterIncrement(ac_counter_inc);\n  o_atomic_dec = atomicCounterDecrement(ac_counter_dec);\n}"
                       ,
                       "#version 310 es\nlayout(location = 0) out uvec4 o_color[2];\nlayout(binding = 1, offset = 16) uniform atomic_uint ac_counter_inc;\nlayout(binding = 7, offset = 128) uniform atomic_uint ac_counter_dec;\nvoid main() {\n  o_color[0] = uvec4(atomicCounterIncrement(ac_counter_inc));\n  o_color[1] = uvec4(atomicCounterDecrement(ac_counter_dec));\n}"
                       ,false);
    this->prog_ = GVar4;
    xfb_var[0] = "o_atomic_inc";
    xfb_var[1] = "o_atomic_dec";
    glu::CallLogWrapper::glTransformFeedbackVaryings(this_00,GVar4,2,xfb_var,0x8c8d);
    glcts::anon_unknown_0::SACSubcaseBase::LinkProgram(&this->super_SACSubcaseBase,this->prog_);
    data[0].m_data[0] = 100;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&init_data,0x100,data[0].m_data,(allocator_type *)&local_4d8);
    buffers = &this->counter_buffer_;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,*buffers);
    glu::CallLogWrapper::glBufferData
              (this_00,0x92c0,
               (long)init_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)init_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
               init_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0x88ea);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    pGVar1 = this->xfb_buffer_;
    glu::CallLogWrapper::glGenBuffers(this_00,2,pGVar1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,*pGVar1);
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,1000,(void *)0x0,0x88e2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,this->xfb_buffer_[1]);
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,1000,(void *)0x0,0x88e2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,0);
    local_4c8 = pGVar1;
    glu::CallLogWrapper::glGenTextures(this_00,2,this->rt_);
    for (lVar6 = 0x11; lVar6 != 0x13; lVar6 = lVar6 + 1) {
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->xfb_buffer_[lVar6 + -0xb]);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
      glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8236,8,8,0,0x8d94,0x1405,(void *)0x0);
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    }
    pGVar1 = &this->fbo_;
    glu::CallLogWrapper::glGenFramebuffers(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,*pGVar1);
    glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,this->rt_[0],0);
    ebo = (GLuint *)0xde1;
    glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce1,0xde1,this->rt_[1],0);
    draw_buffers[0] = 0x8ce0;
    draw_buffers[1] = 0x8ce1;
    glu::CallLogWrapper::glDrawBuffers(this_00,2,draw_buffers);
    pGVar2 = local_4c8;
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,0);
    glcts::anon_unknown_0::SACSubcaseBase::CreateTriangle
              (&this->super_SACSubcaseBase,&this->vao_,&this->vbo_,ebo);
    glu::CallLogWrapper::glBindBufferRange(this_00,0x92c0,1,*buffers,0x10,0x20);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,7,*buffers);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,*pGVar2);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,1,this->xfb_buffer_[1]);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,*pGVar1);
    glu::CallLogWrapper::glViewport(this_00,0,0,8,8);
    glu::CallLogWrapper::glUseProgram(this_00,this->prog_);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->vao_);
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,4);
    glu::CallLogWrapper::glDrawArrays(this_00,4,0,3);
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    lVar6 = 0;
    do {
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)((long)data[0].m_data + lVar6));
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x430);
    glu::CallLogWrapper::glReadBuffer(this_00,0x8ce0);
    glu::CallLogWrapper::glReadPixels(this_00,0,0,8,8,0x8d99,0x1405,data);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,*pGVar2);
    GVar4 = 0xc;
    puVar5 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x8c8e,0,0xc,1);
    tcu::Vector<unsigned_int,_4>::Vector(&local_4d8,*puVar5);
    data[0x40].m_data[0] = local_4d8.m_data[0];
    data[0x40].m_data[1] = local_4d8.m_data[1];
    data[0x40].m_data[2] = local_4d8.m_data[2];
    data[0x40].m_data[3] = local_4d8.m_data[3];
    tcu::Vector<unsigned_int,_4>::Vector(&local_4d8,puVar5[1]);
    data[0x41].m_data[0] = local_4d8.m_data[0];
    data[0x41].m_data[1] = local_4d8.m_data[1];
    data[0x41].m_data[2] = local_4d8.m_data[2];
    data[0x41].m_data[3] = local_4d8.m_data[3];
    tcu::Vector<unsigned_int,_4>::Vector(&local_4d8,puVar5[2]);
    data[0x42].m_data[0] = local_4d8.m_data[0];
    data[0x42].m_data[1] = local_4d8.m_data[1];
    data[0x42].m_data[2] = local_4d8.m_data[2];
    data[0x42].m_data[3] = local_4d8.m_data[3];
    bVar3 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      ((SACSubcaseBase *)0x43,(GLuint)data,(UVec4 *)0x64,GVar4);
    lVar6 = -1;
    if (bVar3) {
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x8c8e);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,0);
      glu::CallLogWrapper::glReadBuffer(this_00,0x8ce1);
      glu::CallLogWrapper::glReadPixels(this_00,0,0,8,8,0x8d99,0x1405,data);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,this->xfb_buffer_[1]);
      GVar4 = 0xc;
      puVar5 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x8c8e,0,0xc,1);
      tcu::Vector<unsigned_int,_4>::Vector(&local_4d8,*puVar5);
      data[0x40].m_data[0] = local_4d8.m_data[0];
      data[0x40].m_data[1] = local_4d8.m_data[1];
      data[0x40].m_data[2] = local_4d8.m_data[2];
      data[0x40].m_data[3] = local_4d8.m_data[3];
      tcu::Vector<unsigned_int,_4>::Vector(&local_4d8,puVar5[1]);
      data[0x41].m_data[0] = local_4d8.m_data[0];
      data[0x41].m_data[1] = local_4d8.m_data[1];
      data[0x41].m_data[2] = local_4d8.m_data[2];
      data[0x41].m_data[3] = local_4d8.m_data[3];
      tcu::Vector<unsigned_int,_4>::Vector(&local_4d8,puVar5[2]);
      data[0x42].m_data[0] = local_4d8.m_data[0];
      data[0x42].m_data[1] = local_4d8.m_data[1];
      data[0x42].m_data[2] = local_4d8.m_data[2];
      data[0x42].m_data[3] = local_4d8.m_data[3];
      bVar3 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                        ((SACSubcaseBase *)0x43,(GLuint)data,(UVec4 *)0x21,GVar4);
      if (bVar3) {
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x8c8e);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,0);
        bVar3 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                          (&this->super_SACSubcaseBase,this->counter_buffer_,0x20,0xa7);
        if (bVar3) {
          bVar3 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                            (&this->super_SACSubcaseBase,this->counter_buffer_,0x80,0x21);
          lVar6 = (ulong)bVar3 - 1;
        }
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&init_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{

		GLint p1, p2, p3, p4;
		glGetIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS, &p1);
		glGetIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTERS, &p2);
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS, &p3);
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTERS, &p4);
		if (p1 < 8 || p2 < 2 || p3 < 8 || p4 < 2)
		{
			OutputNotSupported("GL_MAX_FRAGMENT/VERTEX_ATOMIC_COUNTER_BUFFERS or"
							   "GL_MAX_FRAGMENT/VERTEX_ATOMIC_COUNTERS are less than required");
			return NOT_SUPPORTED;
		}

		// create program
		const char* src_vs =
			"#version 310 es" NL "layout(location = 0) in vec4 i_vertex;" NL "flat out uint o_atomic_inc;" NL
			"flat out uint o_atomic_dec;" NL "layout(binding = 1, offset = 16) uniform atomic_uint ac_counter_inc;" NL
			"layout(binding = 7, offset = 128) uniform atomic_uint ac_counter_dec;" NL "void main() {" NL
			"  gl_Position = i_vertex;" NL "  o_atomic_inc = atomicCounterIncrement(ac_counter_inc);" NL
			"  o_atomic_dec = atomicCounterDecrement(ac_counter_dec);" NL "}";
		const char* src_fs = "#version 310 es" NL "layout(location = 0) out uvec4 o_color[2];" NL
							 "layout(binding = 1, offset = 16) uniform atomic_uint ac_counter_inc;" NL
							 "layout(binding = 7, offset = 128) uniform atomic_uint ac_counter_dec;" NL
							 "void main() {" NL "  o_color[0] = uvec4(atomicCounterIncrement(ac_counter_inc));" NL
							 "  o_color[1] = uvec4(atomicCounterDecrement(ac_counter_dec));" NL "}";
		prog_				   = CreateProgram(src_vs, src_fs, false);
		const char* xfb_var[2] = { "o_atomic_inc", "o_atomic_dec" };
		glTransformFeedbackVaryings(prog_, 2, xfb_var, GL_SEPARATE_ATTRIBS);
		LinkProgram(prog_);

		// create atomic counter buffer
		std::vector<GLuint> init_data(256, 100);
		glGenBuffers(1, &counter_buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, (GLsizeiptr)(init_data.size() * sizeof(GLuint)), &init_data[0],
					 GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		// create transform feedback buffers
		glGenBuffers(2, xfb_buffer_);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[0]);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 1000, NULL, GL_STREAM_COPY);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[1]);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 1000, NULL, GL_STREAM_COPY);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		// create render targets
		const int s = 8;
		glGenTextures(2, rt_);
		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, rt_[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_R32UI, s, s, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, NULL);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		// create fbo
		glGenFramebuffers(1, &fbo_);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, rt_[0], 0);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, GL_TEXTURE_2D, rt_[1], 0);
		const GLenum draw_buffers[2] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };
		glDrawBuffers(2, draw_buffers);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		// create geometry
		CreateTriangle(&vao_, &vbo_, NULL);

		// draw
		glBindBufferRange(GL_ATOMIC_COUNTER_BUFFER, 1, counter_buffer_, 16, 32);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 7, counter_buffer_);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, xfb_buffer_[0]);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1, xfb_buffer_[1]);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glViewport(0, 0, s, s);
		glUseProgram(prog_);
		glBindVertexArray(vao_);
		glBeginTransformFeedback(GL_TRIANGLES);
		glDrawArrays(GL_TRIANGLES, 0, 3);
		glEndTransformFeedback();

		// validate
		UVec4 data[s * s + 3];
		glReadBuffer(GL_COLOR_ATTACHMENT0);
		glReadPixels(0, 0, s, s, GL_RGBA_INTEGER, GL_UNSIGNED_INT, data);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[0]);
		GLuint* data2;
		data2 = static_cast<GLuint*>(
			glMapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 3 * sizeof(GLuint), GL_MAP_READ_BIT));
		data[s * s]		= UVec4(data2[0]);
		data[s * s + 1] = UVec4(data2[1]);
		data[s * s + 2] = UVec4(data2[2]);
		if (!CheckCounterValues(s * s + 3, data, 100))
			return ERROR;
		glUnmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		glReadBuffer(GL_COLOR_ATTACHMENT1);
		glReadPixels(0, 0, s, s, GL_RGBA_INTEGER, GL_UNSIGNED_INT, data);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[1]);
		data2 = static_cast<GLuint*>(
			glMapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 3 * sizeof(GLuint), GL_MAP_READ_BIT));
		data[s * s]		= UVec4(data2[0]);
		data[s * s + 1] = UVec4(data2[1]);
		data[s * s + 2] = UVec4(data2[2]);
		if (!CheckCounterValues(s * s + 3, data, 33))
			return ERROR;
		glUnmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		if (!CheckFinalCounterValue(counter_buffer_, 32, 167))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 128, 33))
			return ERROR;

		return NO_ERROR;
	}